

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

endpoint_type * __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::remote_endpoint
          (endpoint_type *__return_storage_ptr__,reactive_socket_service<asio::ip::tcp> *this,
          implementation_type *impl,error_code *ec)

{
  int iVar1;
  data_type *__addr;
  size_t local_50;
  size_t addr_len;
  endpoint_type endpoint;
  error_code *ec_local;
  implementation_type *impl_local;
  reactive_socket_service<asio::ip::tcp> *this_local;
  
  endpoint.impl_.data_._20_8_ = ec;
  ip::basic_endpoint<asio::ip::tcp>::basic_endpoint
            ((basic_endpoint<asio::ip::tcp> *)((long)&addr_len + 4));
  local_50 = ip::basic_endpoint<asio::ip::tcp>::capacity
                       ((basic_endpoint<asio::ip::tcp> *)((long)&addr_len + 4));
  iVar1 = (impl->super_base_implementation_type).socket_;
  __addr = ip::basic_endpoint<asio::ip::tcp>::data
                     ((basic_endpoint<asio::ip::tcp> *)((long)&addr_len + 4));
  iVar1 = socket_ops::getpeername(iVar1,(sockaddr *)__addr,(socklen_t *)&local_50);
  if (iVar1 == 0) {
    ip::basic_endpoint<asio::ip::tcp>::resize
              ((basic_endpoint<asio::ip::tcp> *)((long)&addr_len + 4),local_50);
    ip::basic_endpoint<asio::ip::tcp>::basic_endpoint
              (__return_storage_ptr__,(basic_endpoint<asio::ip::tcp> *)((long)&addr_len + 4));
  }
  else {
    ip::basic_endpoint<asio::ip::tcp>::basic_endpoint(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

endpoint_type remote_endpoint(const implementation_type& impl,
      asio::error_code& ec) const
  {
    endpoint_type endpoint;
    std::size_t addr_len = endpoint.capacity();
    if (socket_ops::getpeername(impl.socket_,
          endpoint.data(), &addr_len, false, ec))
      return endpoint_type();
    endpoint.resize(addr_len);
    return endpoint;
  }